

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
 __thiscall spvtools::opt::analysis::MatrixConstant::CopyMatrixConstant(MatrixConstant *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = (_func_int *)(**(code **)(**(long **)(in_RSI + 8) + 0x80))();
  pp_Var2 = (_func_int **)operator_new(0x30);
  pp_Var2[1] = p_Var1;
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__CompositeConstant_00937928;
  pp_Var2[5] = *(_func_int **)(p_Var1 + 0x28);
  (this->super_CompositeConstant).super_Constant._vptr_Constant = pp_Var2;
  std::
  vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const*const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>>
            ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
              *)(pp_Var2 + 2),0,*(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RSI + 0x18));
  return (__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<MatrixConstant> CopyMatrixConstant() const {
    auto another = MakeUnique<MatrixConstant>(type_->AsMatrix());
    another->components_.insert(another->components_.end(), components_.begin(),
                                components_.end());
    return another;
  }